

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

bool __thiscall
amrex::BoxArray::contains(BoxArray *this,BoxArray *ba,bool assume_disjoint_ba,IntVect *ng)

{
  element_type *peVar1;
  bool bVar2;
  uint uVar3;
  Box *this_00;
  uint uVar4;
  uint index;
  Box local_68;
  Box local_4c;
  
  peVar1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (*(pointer *)
       ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8) !=
      (peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    minimalBox(&local_68,this);
    this_00 = Box::grow(&local_68,ng);
    minimalBox(&local_4c,ba);
    bVar2 = Box::contains(this_00,&local_4c);
    index = 0;
    if (!bVar2) goto LAB_00512776;
    peVar1 = (ba->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar3 = (uint)(((long)*(pointer *)
                           ((long)&(peVar1->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data) / 0x1c);
    uVar4 = 0;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    do {
      if (uVar4 == index) {
        index = (uint)((int)uVar3 <= (int)index);
        goto LAB_00512776;
      }
      operator[](&local_68,ba,index);
      bVar2 = contains(this,&local_68,assume_disjoint_ba,ng);
      index = index + 1;
    } while (bVar2);
  }
  index = 0;
LAB_00512776:
  return SUB41(index,0);
}

Assistant:

bool
BoxArray::contains (const BoxArray& ba, bool assume_disjoint_ba, const IntVect& ng) const
{
    if (size() == 0) return false;

    if (!minimalBox().grow(ng).contains(ba.minimalBox())) return false;

    for (int i = 0, N = ba.size(); i < N; ++i) {
        if (!contains(ba[i],assume_disjoint_ba, ng)) {
            return false;
        }
    }

    return true;
}